

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sutil.c
# Opt level: O2

void sPrint_SuperNode_Matrix(char *what,SuperMatrix *A)

{
  uint uVar1;
  int iVar2;
  int *piVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  float *pfVar13;
  ulong uVar14;
  long local_68;
  
  local_68 = 0;
  printf("\nSuperNode matrix %s:\n",what);
  printf("Stype %d, Dtype %d, Mtype %d\n",(ulong)A->Stype,(ulong)A->Dtype,(ulong)A->Mtype);
  uVar1 = A->ncol;
  uVar8 = (ulong)uVar1;
  lVar9 = (long)(int)uVar1;
  piVar3 = (int *)A->Store;
  lVar10 = *(long *)(piVar3 + 2);
  lVar4 = *(long *)(piVar3 + 10);
  lVar5 = *(long *)(piVar3 + 0xc);
  lVar6 = *(long *)(piVar3 + 8);
  lVar7 = *(long *)(piVar3 + 6);
  printf("nrow %d, ncol %d, nnz %lld, nsuper %d\n",(ulong)(uint)A->nrow,lVar9,(long)*piVar3,
         (ulong)(uint)piVar3[1]);
  puts("nzval:");
  while (local_68 <= piVar3[1]) {
    lVar12 = local_68 * 4;
    iVar2 = *(int *)(lVar5 + 4 + local_68 * 4);
    local_68 = local_68 + 1;
    uVar11 = (ulong)*(int *)(lVar5 + lVar12);
    for (uVar14 = uVar11; (long)uVar14 < (long)iVar2; uVar14 = uVar14 + 1) {
      pfVar13 = (float *)(lVar10 + (long)*(int *)(*(long *)(piVar3 + 4) + uVar14 * 4) * 4);
      for (lVar12 = (long)*(int *)(lVar6 + uVar11 * 4); lVar12 < *(int *)(lVar6 + 4 + uVar11 * 4);
          lVar12 = lVar12 + 1) {
        printf("%d\t%d\t%e\n",(double)*pfVar13,(ulong)*(uint *)(lVar7 + lVar12 * 4),
               uVar14 & 0xffffffff);
        pfVar13 = pfVar13 + 1;
      }
    }
  }
  printf("\nnzval_colptr: ");
  for (lVar10 = 0; lVar10 <= lVar9; lVar10 = lVar10 + 1) {
    printf("%lld  ",(long)*(int *)(*(long *)(piVar3 + 4) + lVar10 * 4));
  }
  printf("\nrowind: ");
  for (lVar10 = 0; lVar10 < *(int *)(*(long *)(piVar3 + 8) + lVar9 * 4); lVar10 = lVar10 + 1) {
    printf("%lld  ",(long)*(int *)(*(long *)(piVar3 + 6) + lVar10 * 4));
  }
  printf("\nrowind_colptr: ");
  for (lVar10 = 0; lVar10 <= lVar9; lVar10 = lVar10 + 1) {
    printf("%lld  ",(long)*(int *)(*(long *)(piVar3 + 8) + lVar10 * 4));
  }
  printf("\ncol_to_sup: ");
  if ((int)uVar1 < 1) {
    uVar8 = 0;
  }
  for (uVar14 = 0; uVar8 != uVar14; uVar14 = uVar14 + 1) {
    printf("%d  ",(ulong)*(uint *)(lVar4 + uVar14 * 4));
  }
  printf("\nsup_to_col: ");
  for (lVar10 = 0; lVar10 <= (long)piVar3[1] + 1; lVar10 = lVar10 + 1) {
    printf("%d  ",(ulong)*(uint *)(lVar5 + lVar10 * 4));
  }
  putchar(10);
  fflush(_stdout);
  return;
}

Assistant:

void
sPrint_SuperNode_Matrix(char *what, SuperMatrix *A)
{
    SCformat     *Astore;
    register int_t i, j, k, c, d, n, nsup;
    float       *dp;
    int *col_to_sup, *sup_to_col;
    int_t *rowind, *rowind_colptr;
    
    printf("\nSuperNode matrix %s:\n", what);
    printf("Stype %d, Dtype %d, Mtype %d\n", A->Stype,A->Dtype,A->Mtype);
    n = A->ncol;
    Astore = (SCformat *) A->Store;
    dp = (float *) Astore->nzval;
    col_to_sup = Astore->col_to_sup;
    sup_to_col = Astore->sup_to_col;
    rowind_colptr = Astore->rowind_colptr;
    rowind = Astore->rowind;
    printf("nrow %d, ncol %d, nnz %lld, nsuper %d\n", 
	   (int)A->nrow, (int)A->ncol, (long long) Astore->nnz, (int)Astore->nsuper);
    printf("nzval:\n");
    for (k = 0; k <= Astore->nsuper; ++k) {
      c = sup_to_col[k];
      nsup = sup_to_col[k+1] - c;
      for (j = c; j < c + nsup; ++j) {
	d = Astore->nzval_colptr[j];
	for (i = rowind_colptr[c]; i < rowind_colptr[c+1]; ++i) {
	  printf("%d\t%d\t%e\n", (int)rowind[i], (int)j, dp[d++]);
	}
      }
    }
#if 0
    for (i = 0; i < Astore->nzval_colptr[n]; ++i) printf("%f  ", dp[i]);
#endif
    printf("\nnzval_colptr: ");
    for (i = 0; i <= n; ++i) printf("%lld  ", (long long)Astore->nzval_colptr[i]);
    printf("\nrowind: ");
    for (i = 0; i < Astore->rowind_colptr[n]; ++i) 
        printf("%lld  ", (long long)Astore->rowind[i]);
    printf("\nrowind_colptr: ");
    for (i = 0; i <= n; ++i) printf("%lld  ", (long long)Astore->rowind_colptr[i]);
    printf("\ncol_to_sup: ");
    for (i = 0; i < n; ++i) printf("%d  ", col_to_sup[i]);
    printf("\nsup_to_col: ");
    for (i = 0; i <= Astore->nsuper+1; ++i) 
        printf("%d  ", sup_to_col[i]);
    printf("\n");
    fflush(stdout);
}